

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_tuple_primitive_firstInstance
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_heap_mallocObjectHeader_t *psVar1;
  sysbvm_heap_mallocObjectHeader_t *psVar2;
  
  if (argumentCount != 0) {
    sysbvm_error_argumentCountMismatch(0,argumentCount);
  }
  psVar1 = (context->heap).firstMallocObject;
  psVar2 = psVar1 + 1;
  if (psVar1 == (sysbvm_heap_mallocObjectHeader_t *)0x0) {
    psVar2 = (sysbvm_heap_mallocObjectHeader_t *)0x0;
  }
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_firstInstance(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 0) sysbvm_error_argumentCountMismatch(0, argumentCount);

    if(!context->heap.firstMallocObject)
        return SYSBVM_NULL_TUPLE;

    return (sysbvm_tuple_t)(context->heap.firstMallocObject + 1);
}